

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O0

uint64_t aom_sum_squares_2d_i16_avx2(int16_t *src,int stride,int width,int height)

{
  uint64_t uVar1;
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  int16_t *in_RDI;
  int in_stack_00000020;
  int in_stack_00000024;
  int16_t *in_stack_00000028;
  int in_stack_000000cc;
  int in_stack_000000d0;
  int in_stack_000000d4;
  int16_t *in_stack_000000d8;
  int in_stack_0000021c;
  int in_stack_00000220;
  int in_stack_00000224;
  int16_t *in_stack_00000228;
  int16_t *in_stack_fffffffffffffff8;
  
  if (in_EDX == 4 && in_ECX == 4) {
    uVar1 = aom_sum_squares_2d_i16_4x4_sse2(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
  }
  else if (in_EDX == 4 && (in_ECX & 3) == 0) {
    uVar1 = aom_sum_squares_2d_i16_4xn_sse2(in_stack_00000028,in_stack_00000024,in_stack_00000020);
  }
  else if (in_EDX == 8 && (in_ECX & 3) == 0) {
    uVar1 = aom_sum_squares_2d_i16_nxn_sse2
                      (in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cc);
  }
  else if ((in_EDX & 0xf) == 0 && (in_ECX & 3) == 0) {
    uVar1 = aom_sum_squares_2d_i16_nxn_avx2
                      (in_stack_00000228,in_stack_00000224,in_stack_00000220,in_stack_0000021c);
  }
  else {
    uVar1 = aom_sum_squares_2d_i16_c(in_RDI,in_ESI,in_EDX,in_ECX);
  }
  return uVar1;
}

Assistant:

uint64_t aom_sum_squares_2d_i16_avx2(const int16_t *src, int stride, int width,
                                     int height) {
  if (LIKELY(width == 4 && height == 4)) {
    return aom_sum_squares_2d_i16_4x4_sse2(src, stride);
  } else if (LIKELY(width == 4 && (height & 3) == 0)) {
    return aom_sum_squares_2d_i16_4xn_sse2(src, stride, height);
  } else if (LIKELY(width == 8 && (height & 3) == 0)) {
    return aom_sum_squares_2d_i16_nxn_sse2(src, stride, width, height);
  } else if (LIKELY(((width & 15) == 0) && ((height & 3) == 0))) {
    return aom_sum_squares_2d_i16_nxn_avx2(src, stride, width, height);
  } else {
    return aom_sum_squares_2d_i16_c(src, stride, width, height);
  }
}